

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_pkt_generator.c
# Opt level: O3

void rfc5444_writer_flush(rfc5444_writer *writer,rfc5444_writer_target *target,_Bool force)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  list_entity *plVar4;
  long lVar5;
  size_t sVar6;
  uint8_t *puVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  list_entity *plVar11;
  size_t total;
  size_t local_28;
  
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_pkt_generator.c"
                  ,0x77,
                  "void rfc5444_writer_flush(struct rfc5444_writer *, struct rfc5444_writer_target *, _Bool)"
                 );
  }
  if (target->sendPacket ==
      (_func_void_rfc5444_writer_ptr_rfc5444_writer_target_ptr_void_ptr_size_t *)0x0) {
    __assert_fail("target->sendPacket",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_pkt_generator.c"
                  ,0x7a,
                  "void rfc5444_writer_flush(struct rfc5444_writer *, struct rfc5444_writer_target *, _Bool)"
                 );
  }
  if (target->_is_flushed == true) {
    if (!force) {
      return;
    }
    _rfc5444_writer_begin_packet(writer,target);
  }
  writer->_state = RFC5444_WRITER_FINISH_PKTTLV;
  plVar4 = (writer->_pkthandlers).next;
  for (plVar11 = (writer->_pkthandlers).prev; plVar11->next != plVar4; plVar11 = plVar11->prev) {
    if (plVar11[1].prev != (list_entity *)0x0) {
      (*(code *)plVar11[1].prev)(writer,target);
      plVar4 = (writer->_pkthandlers).next;
    }
  }
  writer->_state = RFC5444_WRITER_FINISH_PKTHEADER;
  if (target->finishPacketHeader != (_func_void_rfc5444_writer_ptr_rfc5444_writer_target_ptr *)0x0)
  {
    (*target->finishPacketHeader)(writer,target);
  }
  puVar7 = (target->_pkt).buffer;
  *puVar7 = '\0';
  if (target->_has_seqno == true) {
    pbVar1 = (target->_pkt).buffer;
    *pbVar1 = *pbVar1 | 8;
    puVar7[1] = *(uint8_t *)((long)&target->_seqno + 1);
    puVar7[2] = (uint8_t)target->_seqno;
    puVar7 = puVar7 + 3;
  }
  else {
    puVar7 = puVar7 + 1;
  }
  sVar9 = (target->_pkt).added;
  sVar6 = (target->_pkt).set;
  lVar5 = sVar6 + sVar9;
  if (lVar5 != 0) {
    pbVar1 = (target->_pkt).buffer;
    *pbVar1 = *pbVar1 | 4;
    *puVar7 = (uint8_t)((ulong)lVar5 >> 8);
    puVar7[1] = (uint8_t)lVar5;
    sVar9 = (target->_pkt).added;
    sVar6 = (target->_pkt).set;
  }
  uVar10 = (ulong)((uint)target->_has_seqno * 2);
  lVar5 = uVar10 + 3;
  if (sVar9 + sVar6 == 0) {
    lVar5 = uVar10 + 1;
  }
  if (target->_bin_msgs_size == 0) {
    sVar8 = 0;
  }
  else {
    puVar7 = (target->_pkt).buffer;
    memmove(puVar7 + lVar5 + sVar9 + sVar6,
            puVar7 + (target->_pkt).allocated + sVar9 + (target->_pkt).header,target->_bin_msgs_size
           );
    sVar9 = (target->_pkt).added;
    sVar6 = (target->_pkt).set;
    sVar8 = target->_bin_msgs_size;
  }
  local_28 = sVar6 + sVar9 + sVar8 + lVar5;
  plVar11 = (writer->_processors).list_head.next;
  if (plVar11->prev != (writer->_processors).list_head.prev) {
    do {
      cVar2 = (*(code *)plVar11[4].next)(plVar11,0xffffffff);
      if ((cVar2 != '\0') &&
         (iVar3 = (*(code *)plVar11[4].prev)(plVar11,target,0,(target->_pkt).buffer,&local_28),
         iVar3 != 0)) goto LAB_00113ff7;
      plVar11 = plVar11->next;
    } while (plVar11->prev != (writer->_processors).list_head.prev);
  }
  if (local_28 != 0) {
    (*target->sendPacket)(writer,target,(target->_pkt).buffer,local_28);
  }
LAB_00113ff7:
  (target->_pkt).set = 0;
  target->_bin_msgs_size = 0;
  target->_is_flushed = true;
  writer->_state = RFC5444_WRITER_NONE;
  return;
}

Assistant:

void
rfc5444_writer_flush(struct rfc5444_writer *writer, struct rfc5444_writer_target *target, bool force) {
  struct rfc5444_writer_postprocessor *processor;
  struct rfc5444_writer_pkthandler *handler;
  size_t len, total;
  bool error;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  assert(target->sendPacket);

  if (target->_is_flushed) {
    if (!force) {
      return;
    }

    /* begin a new packet, buffer is flushed at the moment */
    _rfc5444_writer_begin_packet(writer, target);
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_FINISH_PKTTLV;
#endif

  /* finalize packet tlvs */
  list_for_each_element_reverse(&writer->_pkthandlers, handler, _pkthandle_node) {
    if (handler->finishPacketTLVs) {
      handler->finishPacketTLVs(writer, target);
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_FINISH_PKTHEADER;
#endif
  /* finalize packet header */
  if (target->finishPacketHeader) {
    target->finishPacketHeader(writer, target);
  }

  /* write packet header (including tlvblock length if necessary */
  _write_pktheader(target);

  /* calculate true length of header (optional tlv block !) */
  len = 1;
  if (target->_has_seqno) {
    len += 2;
  }
  if (target->_pkt.added + target->_pkt.set > 0) {
    len += 2;
  }

  /* compress packet buffer */
  if (target->_bin_msgs_size) {
    memmove(&target->_pkt.buffer[len + target->_pkt.added + target->_pkt.set],
      &target->_pkt.buffer[target->_pkt.header + target->_pkt.added + target->_pkt.allocated], target->_bin_msgs_size);
  }

  /* run post-processors */
  error = false;
  total = len + target->_pkt.added + target->_pkt.set + target->_bin_msgs_size;
  avl_for_each_element(&writer->_processors, processor, _node) {
    if (processor->is_matching_signature(processor, RFC5444_WRITER_PKT_POSTPROCESSOR)) {
      if (processor->process(processor, target, NULL, &target->_pkt.buffer[0], &total)) {
        /* error, stop postprocessing and drop message */
        error = true;
        break;
      }
    }
  }

  if (!error && total > 0) {
    /* send packet */
    target->sendPacket(writer, target, target->_pkt.buffer, total);
  }

  /* cleanup length information */
  target->_pkt.set = 0;
  target->_bin_msgs_size = 0;

  /* mark buffer as flushed */
  target->_is_flushed = true;

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_NONE;
#endif

#if DEBUG_CLEANUP == true
  memset(target->_pkt.buffer, 252, target->_pkt.max);
#endif
}